

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Obj_t * Abc_NtkFromMappedGia_rec(Abc_Ntk_t *pNtkNew,Gia_Man_t *p,int iObj,int fAddInv)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  char *pSop;
  Abc_Obj_t *pAVar3;
  ulong uVar4;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar2 = p->pObjs[(uint)iObj].Value;
  if ((long)(int)uVar2 < 0) {
    pGVar1 = p->pObjs + (uint)iObj;
    Abc_NtkFromMappedGia_rec(pNtkNew,p,iObj - (*(uint *)pGVar1 & 0x1fffffff),0);
    Abc_NtkFromMappedGia_rec(pNtkNew,p,iObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),0);
    pAVar3 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
    uVar2 = pGVar1[-(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff)].Value;
    if ((-1 < (long)(int)uVar2) && ((int)uVar2 < pNtkNew->vObjs->nSize)) {
      Abc_ObjAddFanin(pAVar3,(Abc_Obj_t *)pNtkNew->vObjs->pArray[(int)uVar2]);
      uVar2 = pGVar1[-(ulong)(*(uint *)&pGVar1->field_0x4 & 0x1fffffff)].Value;
      if ((-1 < (long)(int)uVar2) && ((int)uVar2 < pNtkNew->vObjs->nSize)) {
        Abc_ObjAddFanin(pAVar3,(Abc_Obj_t *)pNtkNew->vObjs->pArray[(int)uVar2]);
        pSop = Abc_SopCreateAnd((Mem_Flex_t *)pNtkNew->pManFunc,2,(int *)0x0);
        (pAVar3->field_5).pData = pSop;
        uVar4 = *(ulong *)pGVar1;
        if (((uint)uVar4 >> 0x1d & 1) != 0) {
          Abc_SopComplementVar(pSop,0);
          uVar4 = *(ulong *)pGVar1;
        }
        if ((uVar4 >> 0x3d & 1) != 0) {
          Abc_SopComplementVar((char *)(pAVar3->field_5).pData,1);
        }
        pGVar1->Value = pAVar3->Id;
        goto LAB_002a5c16;
      }
    }
  }
  else if ((int)uVar2 < pNtkNew->vObjs->nSize) {
    pAVar3 = (Abc_Obj_t *)pNtkNew->vObjs->pArray[(int)uVar2];
LAB_002a5c16:
    if (fAddInv != 0) {
      pAVar3 = Abc_NtkCreateNodeInv(pNtkNew,pAVar3);
      return pAVar3;
    }
    return pAVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Obj_t * Abc_NtkFromMappedGia_rec( Abc_Ntk_t * pNtkNew, Gia_Man_t * p, int iObj, int fAddInv )
{
    Abc_Obj_t * pObjNew;
    Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
    if ( Gia_ObjValue(pObj) >= 0 )
        pObjNew = Abc_NtkObj( pNtkNew, Gia_ObjValue(pObj) );
    else
    {
        Abc_NtkFromMappedGia_rec( pNtkNew, p, Gia_ObjFaninId0(pObj, iObj), 0 );
        Abc_NtkFromMappedGia_rec( pNtkNew, p, Gia_ObjFaninId1(pObj, iObj), 0 );
        pObjNew = Abc_NtkCreateNode( pNtkNew );
        Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
        Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
        pObjNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, 2, NULL );
        if ( Gia_ObjFaninC0(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
        if ( Gia_ObjFaninC1(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
        pObj->Value = Abc_ObjId( pObjNew );
    }
    if ( fAddInv )
        pObjNew = Abc_NtkCreateNodeInv(pNtkNew, pObjNew);
    return pObjNew;
}